

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void freedynamicdata(void)

{
  level *lev_00;
  level *lev;
  int i;
  
  if (objects != (objclass *)0x0) {
    unload_qtlist();
    free_invbuf();
    free_youbuf();
    tmp_at(-7,0);
    for (lev._4_4_ = 0; lev._4_4_ < 0x200; lev._4_4_ = lev._4_4_ + 1) {
      lev_00 = levels[lev._4_4_];
      levels[lev._4_4_] = (level *)0x0;
      if (lev_00 != (level *)0x0) {
        dmonsfree(lev_00);
        free_timers(lev_00);
        free_light_sources(lev_00);
        free_monchn(lev_00->monlist);
        free_worm(lev_00);
        freetrapchn(lev_00->lev_traps);
        free_objchn(lev_00->objlist);
        free_objchn(lev_00->buriedobjlist);
        free_objchn(lev_00->billobjs);
        free_engravings(lev_00);
        freedamage(lev_00);
        free(lev_00);
      }
    }
    free_objchn(invent);
    free_objchn(magic_chest_objs);
    free_monchn(migrating_mons);
    free_monchn(mydogs);
    mon_animal_list('\0');
    free_oracles();
    freefruitchn();
    freenames();
    free_waterlevel();
    free_dungeon();
    free_history();
    if (iflags.ap_rules != (nh_autopickup_rules *)0x0) {
      free((iflags.ap_rules)->rules);
      (iflags.ap_rules)->rules = (nh_autopickup_rule *)0x0;
      free(iflags.ap_rules);
    }
    iflags.ap_rules = (nh_autopickup_rules *)0x0;
    if (iflags.mt_rules != (nh_msgtype_rules *)0x0) {
      free((iflags.mt_rules)->rules);
      (iflags.mt_rules)->rules = (nh_msgtype_rule *)0x0;
      free(iflags.mt_rules);
      iflags.mt_rules = (nh_msgtype_rules *)0x0;
    }
    if (iflags.hp_notify_fmt != (char *)0x0) {
      free(iflags.hp_notify_fmt);
      iflags.hp_notify_fmt = (char *)0x0;
    }
    free(artilist);
    free(objects);
    objects = (objclass *)0x0;
    artilist = (artifact *)0x0;
    if (active_birth_options != (nh_option_desc *)0x0) {
      free_optlist(active_birth_options);
    }
    active_birth_options = (nh_option_desc *)0x0;
  }
  return;
}

Assistant:

void freedynamicdata(void)
{
	int i;
	struct level *lev;
	
	if (!objects)
	    return; /* no cleanup necessary */
	
	unload_qtlist();
	free_invbuf();	/* let_to_name (invent.c) */
	free_youbuf();	/* You_buf,&c (pline.c) */
	tmp_at(DISP_FREEMEM, 0);	/* temporary display effects */
# define free_animals()	 mon_animal_list(FALSE)

	for (i = 0; i < MAXLINFO; i++) {
	    lev = levels[i];
	    levels[i] = NULL;
	    if (!lev) continue;
	    
	    /* level-specific data */
	    dmonsfree(lev);	/* release dead monsters */
	    free_timers(lev);
	    free_light_sources(lev);
	    free_monchn(lev->monlist);
	    free_worm(lev);		/* release worm segment information */
	    freetrapchn(lev->lev_traps);
	    free_objchn(lev->objlist);
	    free_objchn(lev->buriedobjlist);
	    free_objchn(lev->billobjs);
	    free_engravings(lev);
	    freedamage(lev);
	    
	    free(lev);
	}

	/* game-state data */
	free_objchn(invent);
	free_objchn(magic_chest_objs);
	free_monchn(migrating_mons);
	free_monchn(mydogs);		/* ascension or dungeon escape */
	free_animals();
	free_oracles();
	freefruitchn();
	freenames();
	free_waterlevel();
	free_dungeon();
	free_history();

	if (iflags.ap_rules) {
	    free(iflags.ap_rules->rules);
	    iflags.ap_rules->rules = NULL;
	    free(iflags.ap_rules);
	}
	iflags.ap_rules = NULL;
	if (iflags.mt_rules) {
	    free(iflags.mt_rules->rules);
	    iflags.mt_rules->rules = NULL;
	    free(iflags.mt_rules);
	    iflags.mt_rules = NULL;
	}
	if (iflags.hp_notify_fmt) {
	    free(iflags.hp_notify_fmt);
	    iflags.hp_notify_fmt = NULL;
	}

	free(artilist);
	free(objects);
	objects = NULL;
	artilist = NULL;
	
	if (active_birth_options)
	    free_optlist(active_birth_options);
	active_birth_options = NULL;
	
	return;
}